

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

void __thiscall wallet::CWallet::MarkDirty(CWallet *this)

{
  _Hash_node_base *p_Var1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  for (p_Var1 = (this->mapWallet)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    p_Var1[0x12]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[0x1b]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[0x24]._M_nxt = (_Hash_node_base *)0x0;
    p_Var1[0x2d]._M_nxt = (_Hash_node_base *)0x0;
    *(undefined2 *)&p_Var1[0x36]._M_nxt = 1;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::MarkDirty()
{
    {
        LOCK(cs_wallet);
        for (std::pair<const uint256, CWalletTx>& item : mapWallet)
            item.second.MarkDirty();
    }
}